

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O1

base_learner * baseline_setup(options_i *options,vw *all)

{
  options_i *options_00;
  undefined8 uVar1;
  int iVar2;
  baseline *pbVar3;
  _func_int ***ppp_Var4;
  option_group_definition *poVar5;
  example *peVar6;
  base_learner *l;
  single_learner *base;
  learner<baseline,_example> *plVar7;
  bool baseline_option;
  size_type __dnew_4;
  option_group_definition new_options;
  string loss_function;
  string loss_function_type;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_441;
  baseline *local_440;
  _func_int ***local_438;
  _func_int **local_430;
  _func_int **local_428 [2];
  options_i *local_418;
  long local_410;
  _func_int ***local_408;
  _func_int **local_400;
  _func_int **local_3f8 [2];
  _func_int ***local_3e8;
  _func_int **local_3e0;
  _func_int **local_3d8 [2];
  _func_int ***local_3c8;
  _func_int **local_3c0;
  _func_int **local_3b8 [2];
  string local_3a8;
  string local_388;
  option_group_definition local_368;
  long *local_330;
  long local_328;
  long local_320 [2];
  undefined1 *local_310;
  undefined8 local_308;
  undefined1 local_300 [16];
  string local_2f0;
  string local_2d0;
  undefined1 local_2b0 [112];
  bool local_240;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  undefined1 local_210 [112];
  bool local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  undefined1 local_d0 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pbVar3 = calloc_or_throw<baseline>(1);
  pbVar3->ec = (example *)0x0;
  pbVar3->all = (vw *)0x0;
  pbVar3->lr_scaling = false;
  *(undefined3 *)&pbVar3->field_0x11 = 0;
  pbVar3->lr_multiplier = 0.0;
  pbVar3->global_only = false;
  pbVar3->global_initialized = false;
  pbVar3->check_enabled = false;
  *(undefined5 *)&pbVar3->field_0x1b = 0;
  local_441 = false;
  local_310 = local_300;
  local_308 = 0;
  local_300[0] = 0;
  local_2b0._0_8_ = (_func_int **)0x10;
  local_440 = pbVar3;
  local_438 = local_428;
  local_438 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_438,(ulong)local_2b0);
  local_428[0] = (_func_int **)local_2b0._0_8_;
  *(undefined4 *)local_438 = 0x65736142;
  builtin_strncpy((char *)((long)local_438 + 4),"line",4);
  *(undefined4 *)(local_438 + 1) = 0x74706f20;
  builtin_strncpy((char *)((long)local_438 + 0xc),"ions",4);
  local_430 = (_func_int **)local_2b0._0_8_;
  *(char *)((long)local_438 + local_2b0._0_8_) = '\0';
  local_368.m_name._M_dataplus._M_p = (pointer)&local_368.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_368,local_438,(char *)(local_2b0._0_8_ + (long)local_438));
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388.field_2._M_allocated_capacity = 0x656e696c65736162;
  local_388._M_string_length = 8;
  local_388.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_388,&local_441);
  local_240 = true;
  local_3c8 = local_3b8;
  local_d0._0_8_ = (_func_int **)0x5c;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3c8,(ulong)local_d0);
  uVar1 = local_d0._0_8_;
  local_3b8[0] = (_func_int **)local_d0._0_8_;
  local_3c8 = ppp_Var4;
  memcpy(ppp_Var4,
         "Learn an additive baseline (from constant features) and a residual separately in regression."
         ,0x5c);
  local_3c0 = (_func_int **)uVar1;
  *(undefined1 *)((long)ppp_Var4 + uVar1) = 0;
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&local_368,(typed_option<bool> *)local_2b0);
  local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
  local_3a8.field_2._M_allocated_capacity._0_5_ = 0x756d5f726c;
  local_3a8.field_2._M_allocated_capacity._5_3_ = 0x69746c;
  local_3a8.field_2._8_5_ = 0x7265696c70;
  local_3a8._M_string_length = 0xd;
  local_3a8.field_2._M_local_buf[0xd] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_d0,&local_3a8,&pbVar3->lr_multiplier);
  local_3e8 = local_3d8;
  local_170._0_8_ = (_func_int **)0x2b;
  local_3e8 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_3e8,(ulong)local_170);
  local_3d8[0] = (_func_int **)local_170._0_8_;
  builtin_strncpy((char *)((long)local_3e8 + 0x1b),"r baseli",8);
  builtin_strncpy((char *)((long)local_3e8 + 0x23),"ne model",8);
  local_3e8[2] = (_func_int **)0x7265696c7069746c;
  local_3e8[3] = (_func_int **)0x73616220726f6620;
  *local_3e8 = (_func_int **)0x676e696e7261656c;
  local_3e8[1] = (_func_int **)0x756d206574617220;
  local_3e0 = (_func_int **)local_170._0_8_;
  *(char *)((long)local_3e8 + local_170._0_8_) = '\0';
  local_418 = options;
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>
                     (poVar5,(typed_option<float> *)local_d0);
  local_2d0.field_2._M_allocated_capacity._0_7_ = 0x5f6c61626f6c67;
  local_2d0.field_2._7_4_ = 0x796c6e6f;
  local_2d0._M_string_length = 0xb;
  local_2d0.field_2._M_local_buf[0xb] = '\0';
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_2d0,&pbVar3->global_only);
  local_100 = true;
  local_408 = local_3f8;
  local_210._0_8_ = (_func_int **)0x47;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_408,(ulong)local_210);
  uVar1 = local_210._0_8_;
  local_3f8[0] = (_func_int **)local_210._0_8_;
  local_408 = ppp_Var4;
  memcpy(ppp_Var4,"use separate example with only global constant for baseline predictions",0x47);
  local_400 = (_func_int **)uVar1;
  *(undefined1 *)((long)ppp_Var4 + uVar1) = 0;
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_170);
  local_2f0.field_2._M_allocated_capacity._0_5_ = 0x6b63656863;
  local_2f0.field_2._M_allocated_capacity._5_3_ = 0x6e655f;
  local_2f0.field_2._8_5_ = 0x64656c6261;
  local_2f0._M_string_length = 0xd;
  local_2f0.field_2._M_local_buf[0xd] = '\0';
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_2f0,&local_440->check_enabled);
  local_1a0 = true;
  local_410 = 0x38;
  local_330 = local_320;
  local_330 = (long *)std::__cxx11::string::_M_create((ulong *)&local_330,(ulong)&local_410);
  local_320[0] = local_410;
  local_330[4] = 0x61746e6f6320656c;
  local_330[5] = 0x62616e6520736e69;
  local_330[2] = 0x74206e6568772065;
  local_330[3] = 0x706d617865206568;
  *local_330 = 0x65737520796c6e6f;
  local_330[1] = 0x6e696c6573616220;
  local_330[6] = 0x67616c662064656c;
  local_328 = local_410;
  *(char *)((long)local_330 + local_410) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar5,(typed_option<bool> *)local_210);
  if (local_330 != local_320) {
    operator_delete(local_330);
  }
  local_210._0_8_ = &PTR__typed_option_002d8500;
  if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
  }
  pbVar3 = local_440;
  if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p);
  }
  if (local_408 != local_3f8) {
    operator_delete(local_408);
  }
  local_170._0_8_ = &PTR__typed_option_002d8500;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p);
  }
  options_00 = local_418;
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8);
  }
  local_d0._0_8_ = &PTR__typed_option_002d8610;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
    operator_delete(local_3a8._M_dataplus._M_p);
  }
  if (local_3c8 != local_3b8) {
    operator_delete(local_3c8);
  }
  local_2b0._0_8_ = &PTR__typed_option_002d8500;
  if (local_218._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218._M_pi);
  }
  if (local_228._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_368);
  if (local_441 == false) {
    plVar7 = (learner<baseline,_example> *)0x0;
  }
  else {
    peVar6 = VW::alloc_examples(simple_label.label_size,1);
    pbVar3->ec = peVar6;
    peVar6->in_use = true;
    pbVar3->all = all;
    (**all->loss->_vptr_loss_function)(local_2b0);
    iVar2 = std::__cxx11::string::compare(local_2b0);
    if (iVar2 != 0) {
      pbVar3->lr_scaling = true;
    }
    l = setup_base(options_00,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar7 = LEARNER::learner<baseline,example>::init_learner<LEARNER::learner<char,example>>
                       (pbVar3,base,predict_or_learn<true>,predict_or_learn<false>,1,
                        *(prediction_type_t *)(base + 0xd0));
    *(undefined8 *)(plVar7 + 0x48) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x50) = sensitivity;
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
      operator_delete((void *)local_2b0._0_8_);
    }
    pbVar3 = (baseline *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_368.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368.m_name._M_dataplus._M_p != &local_368.m_name.field_2) {
    operator_delete(local_368.m_name._M_dataplus._M_p);
  }
  if (local_310 != local_300) {
    operator_delete(local_310);
  }
  if (pbVar3 != (baseline *)0x0) {
    free(pbVar3);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* baseline_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<baseline>();
  bool baseline_option = false;
  std::string loss_function;

  option_group_definition new_options("Baseline options");
  new_options
      .add(make_option("baseline", baseline_option)
               .keep()
               .help("Learn an additive baseline (from constant features) and a residual separately in regression."))
      .add(make_option("lr_multiplier", data->lr_multiplier).help("learning rate multiplier for baseline model"))
      .add(make_option("global_only", data->global_only)
               .keep()
               .help("use separate example with only global constant for baseline predictions"))
      .add(make_option("check_enabled", data->check_enabled)
               .keep()
               .help("only use baseline when the example contains enabled flag"));
  options.add_and_parse(new_options);

  if (!baseline_option)
    return nullptr;

  // initialize baseline example
  data->ec = VW::alloc_examples(simple_label.label_size, 1);
  data->ec->in_use = true;
  data->all = &all;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "logistic")
    data->lr_scaling = true;

  auto base = as_singleline(setup_base(options, all));

  learner<baseline, example>& l = init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  l.set_sensitivity(sensitivity);
  l.set_finish(finish);

  return make_base(l);
}